

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall
Minisat::vec<Minisat::lbool,_int>::capacity(vec<Minisat::lbool,_int> *this,Size min_cap)

{
  uint uVar1;
  lbool *plVar2;
  undefined8 uVar3;
  uint uVar4;
  uint uVar5;
  
  uVar1 = this->cap;
  if ((int)uVar1 < min_cap) {
    uVar5 = (min_cap - uVar1) + 1 & 0xfffffffe;
    uVar4 = ((int)uVar1 >> 1 & 0xfffffffeU) + 2;
    if ((int)uVar4 < (int)uVar5) {
      uVar4 = uVar5;
    }
    if ((int)(uVar1 ^ 0x7fffffff) < (int)uVar4) {
      uVar3 = __cxa_allocate_exception(1);
      __cxa_throw(uVar3,&OutOfMemoryException::typeinfo,0);
    }
    this->cap = uVar4 + uVar1;
    plVar2 = (lbool *)xrealloc(this->data,(long)(int)(uVar4 + uVar1));
    this->data = plVar2;
  }
  return;
}

Assistant:

void vec<T,_Size>::capacity(Size min_cap) {
    if (cap >= min_cap) return;
    Size add = max((min_cap - cap + 1) & ~1, ((cap >> 1) + 2) & ~1);   // NOTE: grow by approximately 3/2
    const Size size_max = std::numeric_limits<Size>::max();
    if ( ((size_max <= std::numeric_limits<int>::max()) && (add > size_max - cap)))
        throw OutOfMemoryException();

    data = (T*) xrealloc((void *)data, (cap += add) * sizeof(T));
 }